

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhttp.c
# Opt level: O3

HTTP_CLIENT_RESULT
uhttp_client_execute_request
          (HTTP_CLIENT_HANDLE handle,HTTP_CLIENT_REQUEST_TYPE request_type,char *relative_path,
          HTTP_HEADERS_HANDLE http_header_handle,uchar *content,size_t content_len,
          ON_HTTP_REQUEST_CALLBACK on_request_callback,void *callback_ctx)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  HTTP_CLIENT_REQUEST_TYPE *item;
  BUFFER_HANDLE handle_00;
  STRING_HANDLE pSVar3;
  LIST_ITEM_HANDLE item_00;
  HTTP_CLIENT_HANDLE_DATA *http_data;
  HTTP_CLIENT_RESULT HVar4;
  int port_num;
  char *pcVar5;
  size_t sVar6;
  
  if (((on_request_callback == (ON_HTTP_REQUEST_CALLBACK)0x0 || handle == (HTTP_CLIENT_HANDLE)0x0)
      || (content != (uchar *)0x0 && content_len == 0)) ||
     (content_len != 0 && content == (uchar *)0x0)) {
    p_Var2 = xlogging_get_log_function();
    HVar4 = HTTP_CLIENT_INVALID_ARG;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return HTTP_CLIENT_INVALID_ARG;
    }
    pcVar5 = "Invalid parameter sent to execute_request";
    iVar1 = 0x511;
LAB_00104fc3:
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c",
              "uhttp_client_execute_request",iVar1,1,pcVar5);
    return HVar4;
  }
  (handle->recv_msg).on_request_callback = on_request_callback;
  (handle->recv_msg).user_ctx = callback_ctx;
  sVar6 = content_len;
  iVar1 = setup_init_recv_msg(&handle->recv_msg);
  port_num = (int)sVar6;
  if (iVar1 != 0) {
    p_Var2 = xlogging_get_log_function();
    HVar4 = HTTP_CLIENT_ERROR;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return HTTP_CLIENT_ERROR;
    }
    pcVar5 = "Failure allocating http http_data items";
    iVar1 = 0x51c;
    goto LAB_00104fc3;
  }
  item = (HTTP_CLIENT_REQUEST_TYPE *)calloc(1,0x20);
  if (item == (HTTP_CLIENT_REQUEST_TYPE *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                ,"uhttp_client_execute_request",0x524,1,"Failure allocating http data items");
    }
    BUFFER_delete((handle->recv_msg).msg_body);
    (handle->recv_msg).msg_body = (BUFFER_HANDLE)0x0;
    HTTPHeaders_Free((handle->recv_msg).resp_header);
    (handle->recv_msg).resp_header = (HTTP_HEADERS_HANDLE)0x0;
    return HTTP_CLIENT_ERROR;
  }
  *item = request_type;
  if (content_len == 0) {
    handle_00 = (BUFFER_HANDLE)0x0;
  }
  else {
    handle_00 = BUFFER_create(content,content_len);
    *(BUFFER_HANDLE *)(item + 6) = handle_00;
    if (handle_00 == (BUFFER_HANDLE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                  ,"uhttp_client_execute_request",0x532,1,"Failure allocating content buffer");
      }
      BUFFER_delete((handle->recv_msg).msg_body);
      (handle->recv_msg).msg_body = (BUFFER_HANDLE)0x0;
      HTTPHeaders_Free((handle->recv_msg).resp_header);
      (handle->recv_msg).resp_header = (HTTP_HEADERS_HANDLE)0x0;
      goto LAB_0010520f;
    }
  }
  pSVar3 = STRING_new();
  *(STRING_HANDLE *)(item + 4) = pSVar3;
  if (pSVar3 == (STRING_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                ,"uhttp_client_execute_request",0x53c,1,"Failure allocating content buffer");
    }
    BUFFER_delete(handle_00);
  }
  else {
    iVar1 = construct_http_headers
                      (http_header_handle,content_len,pSVar3,SUB81(handle->host_name,0),
                       (char *)(ulong)(uint)handle->port_num,port_num);
    if (iVar1 == 0) {
      item_00 = singlylinkedlist_add(handle->data_list,item);
      if (item_00 == (LIST_ITEM_HANDLE)0x0) {
        STRING_delete(*(STRING_HANDLE *)(item + 4));
        BUFFER_delete(*(BUFFER_HANDLE *)(item + 6));
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          pcVar5 = "Failure adding send data to list";
          iVar1 = 0x555;
          goto LAB_001052f6;
        }
      }
      else if (relative_path == (char *)0x0) {
        pSVar3 = STRING_construct("/");
        *(STRING_HANDLE *)(item + 2) = pSVar3;
        if (pSVar3 != (STRING_HANDLE)0x0) {
          return HTTP_CLIENT_OK;
        }
        singlylinkedlist_remove(handle->data_list,item_00);
        STRING_delete(*(STRING_HANDLE *)(item + 4));
        BUFFER_delete(*(BUFFER_HANDLE *)(item + 6));
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          pcVar5 = "Failure allocating relative path buffer";
          iVar1 = 0x57b;
          goto LAB_001052f6;
        }
      }
      else {
        pSVar3 = STRING_construct(relative_path);
        *(STRING_HANDLE *)(item + 2) = pSVar3;
        if (pSVar3 != (STRING_HANDLE)0x0) {
          return HTTP_CLIENT_OK;
        }
        singlylinkedlist_remove(handle->data_list,item_00);
        STRING_delete(*(STRING_HANDLE *)(item + 4));
        BUFFER_delete(*(BUFFER_HANDLE *)(item + 6));
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          pcVar5 = "Failure allocating relative path buffer";
          iVar1 = 0x566;
LAB_001052f6:
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                    ,"uhttp_client_execute_request",iVar1,1,pcVar5);
        }
      }
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                  ,"uhttp_client_execute_request",0x547,1,"Failure allocating content buffer");
      }
      BUFFER_delete(handle_00);
      STRING_delete(pSVar3);
    }
  }
  BUFFER_delete((handle->recv_msg).msg_body);
  (handle->recv_msg).msg_body = (BUFFER_HANDLE)0x0;
  HTTPHeaders_Free((handle->recv_msg).resp_header);
  (handle->recv_msg).resp_header = (HTTP_HEADERS_HANDLE)0x0;
LAB_0010520f:
  free(item);
  return HTTP_CLIENT_ERROR;
}

Assistant:

HTTP_CLIENT_RESULT uhttp_client_execute_request(HTTP_CLIENT_HANDLE handle, HTTP_CLIENT_REQUEST_TYPE request_type, const char* relative_path,
    HTTP_HEADERS_HANDLE http_header_handle, const unsigned char* content, size_t content_len, ON_HTTP_REQUEST_CALLBACK on_request_callback, void* callback_ctx)
{
    HTTP_CLIENT_RESULT result;
    LIST_ITEM_HANDLE list_item;

    /* Codes_SRS_UHTTP_07_012: [If handle, relativePath, or httpHeadersHandle is NULL then http_client_execute_request shall return HTTP_CLIENT_INVALID_ARG] */
    if (handle == NULL || on_request_callback == NULL ||
        (content != NULL && content_len == 0) || (content == NULL && content_len != 0) )
    {
        result = HTTP_CLIENT_INVALID_ARG;
        LogError("Invalid parameter sent to execute_request");
    }
    else
    {
        HTTP_CLIENT_HANDLE_DATA* http_data = (HTTP_CLIENT_HANDLE_DATA*)handle;

        http_data->recv_msg.on_request_callback = on_request_callback;
        http_data->recv_msg.user_ctx = callback_ctx;
        if (setup_init_recv_msg(&http_data->recv_msg) != 0)
        {
            /* Codes_SRS_UHTTP_07_017: [If any failure encountered http_client_execute_request shall return HTTP_CLIENT_ERROR] */
            LogError("Failure allocating http http_data items");
            result = HTTP_CLIENT_ERROR;
        }
        else
        {
            HTTP_SEND_DATA* send_data = (HTTP_SEND_DATA*)malloc(sizeof(HTTP_SEND_DATA));
            if (send_data == NULL)
            {
                LogError("Failure allocating http data items");
                BUFFER_delete(http_data->recv_msg.msg_body);
                http_data->recv_msg.msg_body = NULL;
                HTTPHeaders_Free(http_data->recv_msg.resp_header);
                http_data->recv_msg.resp_header = NULL;
                result = HTTP_CLIENT_ERROR;
            }
            else
            {
                memset(send_data, 0, sizeof(HTTP_SEND_DATA));
                /* Codes_SRS_UHTTP_07_041: [HTTP_CLIENT_REQUEST_TYPE shall support all request types specified under section 9.1.2 in the spec.] */
                send_data->request_type = request_type;
                if ( (content_len > 0) && (send_data->content = BUFFER_create(content, content_len)) == NULL)
                {
                    LogError("Failure allocating content buffer");
                    result = HTTP_CLIENT_ERROR;
                    BUFFER_delete(http_data->recv_msg.msg_body);
                    http_data->recv_msg.msg_body = NULL;
                    HTTPHeaders_Free(http_data->recv_msg.resp_header);
                    http_data->recv_msg.resp_header = NULL;
                    free(send_data);
                }
                else if ((send_data->header_line = STRING_new()) == NULL)
                {
                    LogError("Failure allocating content buffer");
                    result = HTTP_CLIENT_ERROR;
                    BUFFER_delete(send_data->content);
                    BUFFER_delete(http_data->recv_msg.msg_body);
                    http_data->recv_msg.msg_body = NULL;
                    HTTPHeaders_Free(http_data->recv_msg.resp_header);
                    http_data->recv_msg.resp_header = NULL;
                    free(send_data);
                }
                else if (construct_http_headers(http_header_handle, content_len, send_data->header_line, false, http_data->host_name, http_data->port_num))
                {
                    LogError("Failure allocating content buffer");
                    result = HTTP_CLIENT_ERROR;
                    BUFFER_delete(send_data->content);
                    STRING_delete(send_data->header_line);
                    BUFFER_delete(http_data->recv_msg.msg_body);
                    http_data->recv_msg.msg_body = NULL;
                    HTTPHeaders_Free(http_data->recv_msg.resp_header);
                    http_data->recv_msg.resp_header = NULL;
                    free(send_data);
                }
                else if ((list_item = singlylinkedlist_add(http_data->data_list, send_data)) == NULL)
                {
                    STRING_delete(send_data->header_line);
                    BUFFER_delete(send_data->content);
                    LogError("Failure adding send data to list");
                    result = HTTP_CLIENT_ERROR;
                    BUFFER_delete(http_data->recv_msg.msg_body);
                    http_data->recv_msg.msg_body = NULL;
                    HTTPHeaders_Free(http_data->recv_msg.resp_header);
                    http_data->recv_msg.resp_header = NULL;
                    free(send_data);
                }
                else
                {
                    if (relative_path != NULL)
                    {
                        if ((send_data->relative_path = STRING_construct(relative_path)) == NULL)
                        {
                            (void)singlylinkedlist_remove(http_data->data_list, list_item);
                            STRING_delete(send_data->header_line);
                            BUFFER_delete(send_data->content);
                            LogError("Failure allocating relative path buffer");
                            BUFFER_delete(http_data->recv_msg.msg_body);
                            http_data->recv_msg.msg_body = NULL;
                            HTTPHeaders_Free(http_data->recv_msg.resp_header);
                            http_data->recv_msg.resp_header = NULL;
                            free(send_data);
                            result = HTTP_CLIENT_ERROR;
                        }
                        else
                        {
                            /* Codes_SRS_UHTTP_07_018: [upon success http_client_execute_request shall return HTTP_CLIENT_OK.] */
                            result = HTTP_CLIENT_OK;
                        }
                    }
                    else
                    {
                        if ((send_data->relative_path = STRING_construct("/")) == NULL)
                        {
                            (void)singlylinkedlist_remove(http_data->data_list, list_item);
                            STRING_delete(send_data->header_line);
                            BUFFER_delete(send_data->content);
                            LogError("Failure allocating relative path buffer");
                            BUFFER_delete(http_data->recv_msg.msg_body);
                            http_data->recv_msg.msg_body = NULL;
                            HTTPHeaders_Free(http_data->recv_msg.resp_header);
                            http_data->recv_msg.resp_header = NULL;
                            free(send_data);
                            result = HTTP_CLIENT_ERROR;
                        }
                        else
                        {
                            /* Codes_SRS_UHTTP_07_018: [upon success http_client_execute_request shall return HTTP_CLIENT_OK.] */
                            result = HTTP_CLIENT_OK;
                        }
                    }
                }
            }
        }
    }
    return result;
}